

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall PClassActor::SetDamageFactor(PClassActor *this,FName *type,double factor)

{
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this_00;
  double local_28;
  FName local_1c;
  
  local_28 = factor;
  if (this->DamageFactors == (DmgFactors *)0x0) {
    this_00 = (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)operator_new(0x18);
    this_00->NumUsed = 0;
    TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::SetNodeVector(this_00,1);
    this->DamageFactors = (DmgFactors *)this_00;
  }
  local_1c = (FName)type->Index;
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::Insert
            (&this->DamageFactors->
              super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>,&local_1c,
             &local_28);
  return;
}

Assistant:

void PClassActor::SetDamageFactor(FName type, double factor)
{
	if (DamageFactors == NULL)
	{
		DamageFactors = new DmgFactors;
	}
	DamageFactors->Insert(type, factor);
}